

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryInputGeometryShaderTests.cpp
# Opt level: O0

void __thiscall
vkt::geometry::anon_unknown_2::GeometryExpanderRenderTest::GeometryExpanderRenderTest
          (GeometryExpanderRenderTest *this,TestContext *testCtx,PrimitiveTestSpec *inputPrimitives)

{
  char *pcVar1;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  PrimitiveTestSpec *local_20;
  PrimitiveTestSpec *inputPrimitives_local;
  TestContext *testCtx_local;
  GeometryExpanderRenderTest *this_local;
  
  pcVar1 = inputPrimitives->name;
  local_20 = inputPrimitives;
  inputPrimitives_local = (PrimitiveTestSpec *)testCtx;
  testCtx_local = (TestContext *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,pcVar1,&local_41);
  pcVar1 = local_20->name;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,pcVar1,&local_79);
  TestCase::TestCase(&this->super_TestCase,testCtx,&local_40,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__GeometryExpanderRenderTest_016cd1c0;
  this->m_primitiveType = local_20->primitiveType;
  this->m_outputType = local_20->outputType;
  return;
}

Assistant:

GeometryExpanderRenderTest::GeometryExpanderRenderTest (TestContext& testCtx, const PrimitiveTestSpec& inputPrimitives)
	: TestCase			(testCtx, inputPrimitives.name, inputPrimitives.name)
	, m_primitiveType	(inputPrimitives.primitiveType)
	, m_outputType		(inputPrimitives.outputType)
{

}